

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

Abc_Obj_t * Abc_NodeFromGlobalBdds(Abc_Ntk_t *pNtkNew,DdManager *dd,DdNode *bFunc,int fReverse)

{
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar1;
  DdNode *n;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  
  pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  pVVar1 = pNtkNew->vCis;
  uVar2 = (ulong)(uint)pVVar1->nSize;
  if (0 < pVVar1->nSize) {
    lVar4 = 0;
    do {
      uVar3 = ~dd->invperm[lVar4] + (uint)uVar2;
      if (fReverse == 0) {
        uVar3 = dd->invperm[lVar4];
      }
      if (((int)uVar3 < 0) || ((uint)uVar2 <= uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin(pObj,(Abc_Obj_t *)pVVar1->pArray[uVar3]);
      lVar4 = lVar4 + 1;
      pVVar1 = pNtkNew->vCis;
      uVar2 = (ulong)pVVar1->nSize;
    } while (lVar4 < (long)uVar2);
  }
  n = Extra_TransferLevelByLevel(dd,(DdManager *)pNtkNew->pManFunc,bFunc);
  (pObj->field_5).pData = n;
  Cudd_Ref(n);
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NodeFromGlobalBdds( Abc_Ntk_t * pNtkNew, DdManager * dd, DdNode * bFunc, int fReverse )
{
    Abc_Obj_t * pNodeNew, * pTemp;
    int i;
    // create a new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins in the order, in which they appear in the reordered manager
    Abc_NtkForEachCi( pNtkNew, pTemp, i )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, fReverse ? Abc_NtkCiNum(pNtkNew)-1-dd->invperm[i] : dd->invperm[i]) );
    // transfer the function
    pNodeNew->pData = Extra_TransferLevelByLevel( dd, (DdManager *)pNtkNew->pManFunc, bFunc );  Cudd_Ref( (DdNode *)pNodeNew->pData );
    return pNodeNew;
}